

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::EnumSchema::Enumerant>::dispose
          (ArrayBuilder<capnp::EnumSchema::Enumerant> *this)

{
  Enumerant *firstElement;
  RemoveConst<capnp::EnumSchema::Enumerant> *pRVar1;
  Enumerant *pEVar2;
  Enumerant *endCopy;
  Enumerant *posCopy;
  Enumerant *ptrCopy;
  ArrayBuilder<capnp::EnumSchema::Enumerant> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pEVar2 = this->endPtr;
  if (firstElement != (Enumerant *)0x0) {
    this->ptr = (Enumerant *)0x0;
    this->pos = (RemoveConst<capnp::EnumSchema::Enumerant> *)0x0;
    this->endPtr = (Enumerant *)0x0;
    ArrayDisposer::dispose<capnp::EnumSchema::Enumerant>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 6,
               (long)pEVar2 - (long)firstElement >> 6);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }